

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# panes.c
# Opt level: O2

pane_t_conflict * text_post(buffer_t *buffer,wchar_t width,wchar_t height)

{
  text_pane_t *pane;
  pane_t_conflict *ppVar1;
  
  pane = (text_pane_t *)malloc(0x10);
  pane->buffer = buffer;
  text_scroll(pane,buffer->cursor);
  ppVar1 = (pane_t_conflict *)malloc(0x30);
  ppVar1->driver = text_driver;
  ppVar1->unpost = text_unpost;
  ppVar1->scroll = text_scroll;
  ppVar1->options = &TEXT_OPT;
  ppVar1->user_data = pane;
  ppVar1->type = PANE_TEXT;
  text_update(pane,width,height);
  return ppVar1;
}

Assistant:

pane_t*
text_post(buffer_t *buffer, int width, int height)
{
    text_pane_t *text_pane = malloc(sizeof(text_pane_t));
    text_pane->buffer = buffer;
    text_scroll((void*) text_pane, buffer->cursor);

    pane_t *pane = malloc(sizeof(pane_t));
    pane->driver = text_driver;
    pane->unpost = text_unpost;
    pane->scroll = text_scroll;
    pane->options = &TEXT_OPT;
    pane->user_data = text_pane;
    pane->type = PANE_TEXT;

    text_update(text_pane, width, height);

    return pane;
}